

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy>::do_line
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::encoder_strategy> *this,
          sample_type *param_1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  sample_type sVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint rc;
  int qs;
  uint rb;
  
  uVar9 = 0;
  uVar8 = (uint)*this->previous_line_;
  rc = (uint)this->previous_line_[-1];
  while (rb = uVar8, uVar8 = (uint)uVar9, uVar8 < this->width_) {
    lVar10 = (long)(int)uVar8;
    bVar1 = this->current_line_[lVar10 + -1];
    bVar2 = this->previous_line_[lVar10 + 1];
    iVar5 = quantize_gradient(this,bVar2 - rb);
    iVar6 = quantize_gradient(this,rb - rc);
    iVar7 = quantize_gradient(this,rc - bVar1);
    qs = (iVar5 * 9 + iVar6) * 9 + iVar7;
    if (qs == 0) {
      iVar5 = do_run_mode(this,uVar8,(encoder_strategy *)0x0);
      uVar8 = iVar5 + uVar8;
      rc = (uint)this->previous_line_[(long)(int)uVar8 + -1];
      uVar9 = (ulong)uVar8;
      uVar8 = (uint)this->previous_line_[(int)uVar8];
    }
    else {
      uVar9 = lVar10 + 1;
      bVar3 = this->current_line_[lVar10];
      iVar5 = get_predicted_value((uint)bVar1,rb,rc);
      sVar4 = do_regular(this,qs,(uint)bVar3,iVar5,(encoder_strategy *)0x0);
      this->current_line_[lVar10] = sVar4;
      uVar8 = (uint)bVar2;
      rc = rb;
    }
  }
  return;
}

Assistant:

FORCE_INLINE void do_line(sample_type* /*template_selector*/)
    {
        int32_t index{};
        int32_t rb{previous_line_[index - 1]};
        int32_t rd{previous_line_[index]};

        while (static_cast<uint32_t>(index) < width_)
        {
            const int32_t ra{current_line_[index - 1]};
            const int32_t rc{rb};
            rb = rd;
            rd = previous_line_[index + 1];

            const int32_t qs{
                compute_context_id(quantize_gradient(rd - rb), quantize_gradient(rb - rc), quantize_gradient(rc - ra))};

            if (qs != 0)
            {
                current_line_[index] =
                    do_regular(qs, current_line_[index], get_predicted_value(ra, rb, rc), static_cast<Strategy*>(nullptr));
                ++index;
            }
            else
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
                rb = previous_line_[index - 1];
                rd = previous_line_[index];
            }
        }
    }